

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::SetVertex(ON_Mesh *this,int vertex_index,ON_3fPoint *vertex_location)

{
  float fVar1;
  ON_3fPoint *pOVar2;
  uint uVar3;
  uint uVar4;
  ON_3dPoint *this_00;
  ON_3fPoint *pOVar5;
  bool local_49;
  ON_3dPoint local_48;
  uint local_2c;
  bool local_25;
  uint i;
  bool rc;
  ON_3fPoint *pOStack_20;
  uint vertex_count;
  ON_3fPoint *vertex_location_local;
  ON_Mesh *pOStack_10;
  int vertex_index_local;
  ON_Mesh *this_local;
  
  pOStack_20 = vertex_location;
  vertex_location_local._4_4_ = vertex_index;
  pOStack_10 = this;
  uVar3 = VertexUnsignedCount(this);
  local_49 = -1 < (int)vertex_location_local._4_4_ && vertex_location_local._4_4_ <= uVar3;
  local_25 = local_49;
  if (-1 < (int)vertex_location_local._4_4_ && vertex_location_local._4_4_ <= uVar3) {
    local_2c = vertex_location_local._4_4_;
    i = uVar3;
    uVar4 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                      (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
    pOVar2 = pOStack_20;
    if (uVar3 == uVar4) {
      if (local_2c < i) {
        this_00 = ON_SimpleArray<ON_3dPoint>::operator[]
                            (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,local_2c);
        ON_3dPoint::operator=(this_00,pOVar2);
      }
      else {
        ON_3dPoint::ON_3dPoint(&local_48,pOStack_20);
        ON_SimpleArray<ON_3dPoint>::Append(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,&local_48)
        ;
      }
    }
    uVar3 = i;
    uVar4 = ON_SimpleArray<ON_3fPoint>::UnsignedCount(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>)
    ;
    pOVar2 = pOStack_20;
    if (uVar3 == uVar4) {
      if (local_2c < i) {
        pOVar5 = ON_SimpleArray<ON_3fPoint>::operator[]
                           (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,local_2c);
        fVar1 = pOVar2->y;
        pOVar5->x = pOVar2->x;
        pOVar5->y = fVar1;
        pOVar5->z = pOVar2->z;
      }
      else {
        ON_SimpleArray<ON_3fPoint>::Append(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,pOStack_20)
        ;
      }
    }
  }
  return (bool)(local_25 & 1);
}

Assistant:

bool ON_Mesh::SetVertex(
       int vertex_index,
       const ON_3fPoint& vertex_location
       )
{
  const unsigned int vertex_count = VertexUnsignedCount();
  const bool rc = vertex_index >= 0 && ((unsigned int)vertex_index) <= vertex_count;
  if ( rc )
  {
    const unsigned int i = (unsigned int)vertex_index;
    if ( vertex_count == m_dV.UnsignedCount() )
    {
      if ( i < vertex_count ) 
        m_dV[i] = vertex_location;
      else
        m_dV.Append(vertex_location);
    }
    if ( vertex_count == m_V.UnsignedCount() )
    {
      if ( i < vertex_count ) 
        m_V[i] = vertex_location;
      else
        m_V.Append(vertex_location);
    }
  }
  return rc;
}